

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxList * amrex::GetBndryCells(BoxList *__return_storage_ptr__,BoxArray *ba,int ngrow)

{
  pointer pBVar1;
  pointer ppVar2;
  IndexType _btype;
  int index;
  Box *gbx;
  pointer bx;
  int iVar3;
  pointer ppVar4;
  BoxList *__range1;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxList bl_tmp;
  BoxList bcells;
  BoxList pieces;
  BoxList bl_diff;
  BoxList local_b8;
  BoxArray tba;
  
  _btype = BATransformer::index_type(&ba->m_bat);
  BoxArray::boxList(&bcells,ba);
  BoxList::simplify(&bcells,false);
  BoxArray::BoxArray(&tba,&bcells);
  BoxList::BoxList(__return_storage_ptr__,_btype);
  BoxList::BoxList(&bl_diff,_btype);
  index = 0;
  iVar3 = (int)(((long)((tba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)((tba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x1c);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != index; index = index + 1) {
    BoxArray::operator[]((Box *)&pieces,&tba,index);
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_;
    bl_tmp.btype.itype = pieces.btype.itype;
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ =
         (int)pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start;
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ =
         (int)((ulong)pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x20);
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ =
         (int)pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish - ngrow;
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ =
         pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_finish._4_4_ + ngrow;
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                 .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_ - ngrow,
                                 (int)bl_tmp.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start - ngrow);
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)pieces.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + ngrow;
    bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         bl_tmp.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ + ngrow;
    boxDiff(&bl_diff,(Box *)&bl_tmp,(Box *)&pieces);
    BoxList::join(__return_storage_ptr__,&bl_diff);
  }
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BoxList::clear(&bcells);
  BoxList::BoxList(&pieces,_btype);
  BoxList::BoxList(&bl_tmp,_btype);
  pBVar1 = (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (bx = (__return_storage_ptr__->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start; bx != pBVar1; bx = bx + 1) {
    BoxArray::intersections(&tba,bx,&isects);
    if (isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bcells,bx);
    }
    else {
      BoxList::clear(&pieces);
      ppVar2 = isects.
               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar4 = isects.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1
          ) {
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&pieces,&ppVar4->second);
      }
      BoxList::complementIn(&bl_tmp,bx,&pieces);
      BoxList::join(&bcells,&bl_tmp);
    }
  }
  removeOverlap(&local_b8,&bcells);
  BoxList::operator=(__return_storage_ptr__,&local_b8);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_b8);
  BoxList::simplify(__return_storage_ptr__,false);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_tmp);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&pieces);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_diff);
  BoxArray::~BoxArray(&tba);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bcells);
  return __return_storage_ptr__;
}

Assistant:

BoxList
GetBndryCells (const BoxArray& ba,
               int             ngrow)
{
    BL_ASSERT(ba.ok());
    BL_ASSERT(ba.size() > 0);
    //
    // First get list of all ghost cells.
    //
    const IndexType btype = ba.ixType();

    BoxList bcells = ba.boxList();
    bcells.simplify();

    BoxArray tba(bcells);

    BoxList gcells(btype);
    BoxList bl_diff(btype);
    for (int i = 0, N = tba.size(); i < N; ++i)
    {
        const Box& bx = tba[i];
        amrex::boxDiff(bl_diff, amrex::grow(bx,ngrow), bx);
        gcells.join(bl_diff);
    }
    //
    // Now strip out intersections with original BoxArray.
    //
    std::vector< std::pair<int,Box> > isects;

    bcells.clear();
    BoxList pieces(btype);
    BoxList bl_tmp(btype);

    for (const Box& gbx : gcells)
    {
        tba.intersections(gbx, isects);
        if (isects.empty())
        {
            bcells.push_back(gbx);
        }
        else
        {
            pieces.clear();
            for (const auto& isec : isects) {
                pieces.push_back(isec.second);
            }
            bl_tmp.complementIn(gbx,pieces);
            bcells.join(bl_tmp);
        }
    }

    gcells = amrex::removeOverlap(bcells);
    gcells.simplify();

    return gcells;
}